

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_text(nk_text_edit *state,char *text,int total_len)

{
  int iVar1;
  nk_rune nVar2;
  nk_rune *pnVar3;
  nk_str *s;
  int iVar4;
  nk_rune unicode;
  nk_str *local_48;
  char *local_40;
  nk_text_undo_state *local_38;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2e6d,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  if (text != (char *)0x0) {
    if (((total_len != 0) && (state->mode != '\0')) &&
       (iVar1 = nk_utf_decode(text,&unicode,total_len), iVar1 != 0)) {
      local_48 = &state->string;
      local_38 = &state->undo;
      iVar4 = 0;
      iVar1 = 1;
      local_40 = text;
      while (((total_len - iVar4 != 0 && iVar4 <= total_len && (iVar1 != 0)) &&
             ((unicode != 0x7f && ((unicode != 10 || (state->single_line == '\0'))))))) {
        if ((state->filter == (nk_plugin_filter)0x0) ||
           (iVar1 = (*state->filter)(state,unicode), iVar1 != 0)) {
          if ((state->select_start == state->select_end) &&
             (iVar1 = state->cursor, iVar1 < (state->string).len)) {
            s = local_48;
            if (state->mode == '\x02') {
              pnVar3 = nk_textedit_createundo(local_38,iVar1,1,1);
              s = local_48;
              if (pnVar3 != (nk_rune *)0x0) {
                nVar2 = nk_str_rune_at(local_48,iVar1);
                *pnVar3 = nVar2;
              }
              nk_str_delete_runes(s,state->cursor,1);
              iVar1 = state->cursor;
            }
            nk_str_insert_text_utf8(s,iVar1,local_40 + iVar4,1);
          }
          else {
            nk_textedit_delete_selection(state);
            nk_str_insert_text_utf8(local_48,state->cursor,local_40 + iVar4,1);
            nk_textedit_makeundo_insert(state,state->cursor,1);
          }
          state->cursor = state->cursor + 1;
          state->has_preferred_x = '\0';
          text = local_40;
        }
        iVar1 = nk_utf_decode(text + iVar4,&unicode,total_len - iVar4);
        iVar4 = iVar4 + iVar1;
      }
    }
    return;
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x2e6e,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
}

Assistant:

NK_API void
nk_textedit_text(struct nk_text_edit *state, const char *text, int total_len)
{
    nk_rune unicode;
    int glyph_len;
    int text_len = 0;

    NK_ASSERT(state);
    NK_ASSERT(text);
    if (!text || !total_len || state->mode == NK_TEXT_EDIT_MODE_VIEW) return;

    glyph_len = nk_utf_decode(text, &unicode, total_len);
    if (!glyph_len) return;
    while ((text_len < total_len) && glyph_len)
    {
        /* don't insert a backward delete, just process the event */
        if (unicode == 127)
            break;

        /* can't add newline in single-line mode */
        if (unicode == '\n' && state->single_line)
            break;

        /* filter incoming text */
        if (state->filter && !state->filter(state, unicode)) {
            glyph_len = nk_utf_decode(text + text_len, &unicode, total_len-text_len);
            text_len += glyph_len;
            continue;
        }

        if (!NK_TEXT_HAS_SELECTION(state) &&
            state->cursor < state->string.len)
        {
            if (state->mode == NK_TEXT_EDIT_MODE_REPLACE) {
                nk_textedit_makeundo_replace(state, state->cursor, 1, 1);
                nk_str_delete_runes(&state->string, state->cursor, 1);
            }
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        } else {
            nk_textedit_delete_selection(state); /* implicitly clamps */
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                nk_textedit_makeundo_insert(state, state->cursor, 1);
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        }
        glyph_len = nk_utf_decode(text + text_len, &unicode, total_len-text_len);
        text_len += glyph_len;
    }
}